

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

Ops * __thiscall
miniscript::Node<unsigned_int>::CalcOps(Ops *__return_storage_ptr__,Node<unsigned_int> *this)

{
  uint32_t uVar1;
  long lVar2;
  pointer psVar3;
  MaxInt<unsigned_int> MVar4;
  element_type *peVar5;
  MaxInt<unsigned_int> MVar6;
  long lVar7;
  uint32_t uVar8;
  size_t j;
  ulong uVar9;
  MaxInt<unsigned_int> *b;
  element_type *peVar10;
  pointer psVar11;
  MaxInt<unsigned_int> *a;
  long in_FS_OFFSET;
  MaxInt<unsigned_int> local_80;
  MaxInt<unsigned_int> local_78;
  MaxInt<unsigned_int> local_70;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  next_sats;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  sats;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->fragment) {
  case JUST_0:
    __return_storage_ptr__->count = 0;
    (__return_storage_ptr__->sat).valid = false;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).value = 0;
    goto LAB_00325f09;
  case JUST_1:
    __return_storage_ptr__->count = 0;
    break;
  case PK_K:
    __return_storage_ptr__->count = 0;
    goto LAB_00325faa;
  case PK_H:
    __return_storage_ptr__->count = 3;
    goto LAB_00325faa;
  case OLDER:
  case AFTER:
    __return_storage_ptr__->count = 1;
    break;
  case SHA256:
  case HASH256:
  case RIPEMD160:
  case HASH160:
    __return_storage_ptr__->count = 4;
    break;
  case WRAP_A:
    peVar5 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar8 = (peVar5->ops).count + 2;
    goto LAB_00325d20;
  case WRAP_S:
  case WRAP_C:
  case WRAP_N:
    peVar5 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar8 = (peVar5->ops).count + 1;
LAB_00325d20:
    MVar4 = *(MaxInt<unsigned_int> *)((long)&peVar5->ops + 4);
    MVar6 = *(MaxInt<unsigned_int> *)((long)&peVar5->ops + 0xc);
    __return_storage_ptr__->count = uVar8;
    __return_storage_ptr__->sat = MVar4;
    __return_storage_ptr__->dsat = MVar6;
    goto LAB_00325fb7;
  case WRAP_D:
    peVar5 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar8 = (peVar5->ops).count + 3;
    goto LAB_00325efc;
  case WRAP_V:
    peVar5 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    MVar4 = *(MaxInt<unsigned_int> *)((long)&peVar5->ops + 4);
    __return_storage_ptr__->count =
         (peVar5->ops).count + (uint)(((peVar5->typ).m_flags >> 0xd & 1) != 0);
    goto LAB_00325d8f;
  case WRAP_J:
    peVar5 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar8 = (peVar5->ops).count + 4;
LAB_00325efc:
    MVar4 = *(MaxInt<unsigned_int> *)((long)&peVar5->ops + 4);
    __return_storage_ptr__->count = uVar8;
    __return_storage_ptr__->sat = MVar4;
LAB_00325f09:
    (__return_storage_ptr__->dsat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).value = 0;
    goto LAB_00325fb7;
  case AND_V:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar11->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar11[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    uVar8 = (peVar10->ops).count + (peVar5->ops).count;
    MVar4 = miniscript::internal::operator+
                      ((MaxInt<unsigned_int> *)((long)&peVar5->ops + 4),
                       (MaxInt<unsigned_int> *)((long)&peVar10->ops + 4));
    goto LAB_00325d8b;
  case AND_B:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar11->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar11[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    uVar8 = (peVar5->ops).count + (peVar10->ops).count + 1;
    MVar6 = miniscript::internal::operator+
                      ((MaxInt<unsigned_int> *)((long)&peVar5->ops + 4),
                       (MaxInt<unsigned_int> *)((long)&peVar10->ops + 4));
    goto LAB_00325edc;
  case OR_B:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar11->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar11[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    uVar8 = (peVar5->ops).count + (peVar10->ops).count + 1;
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)miniscript::internal::operator+
                            ((MaxInt<unsigned_int> *)((long)&peVar5->ops + 4),
                             (MaxInt<unsigned_int> *)((long)&peVar10->ops + 0xc));
    a = (MaxInt<unsigned_int> *)&sats;
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    MVar4 = miniscript::internal::operator+
                      ((MaxInt<unsigned_int> *)
                       ((long)&(psVar11[1].
                                super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->ops + 4),
                       (MaxInt<unsigned_int> *)
                       ((long)&((psVar11->
                                super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->ops + 0xc));
    b = (MaxInt<unsigned_int> *)&next_sats;
    goto LAB_00325ed1;
  case OR_C:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar11->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar11[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    uVar8 = (peVar5->ops).count + (peVar10->ops).count + 2;
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)miniscript::internal::operator+
                            ((MaxInt<unsigned_int> *)((long)&peVar10->ops + 4),
                             (MaxInt<unsigned_int> *)((long)&peVar5->ops + 0xc));
    MVar4 = miniscript::internal::operator|
                      ((MaxInt<unsigned_int> *)((long)&peVar5->ops + 4),
                       (MaxInt<unsigned_int> *)&sats);
LAB_00325d8b:
    __return_storage_ptr__->count = uVar8;
LAB_00325d8f:
    __return_storage_ptr__->sat = MVar4;
    goto LAB_00325e7e;
  case OR_D:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar11->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar11[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    uVar8 = (peVar5->ops).count + (peVar10->ops).count + 3;
    a = (MaxInt<unsigned_int> *)((long)&peVar5->ops + 4);
    MVar4 = miniscript::internal::operator+
                      ((MaxInt<unsigned_int> *)((long)&peVar10->ops + 4),
                       (MaxInt<unsigned_int> *)((long)&peVar5->ops + 0xc));
    b = (MaxInt<unsigned_int> *)&sats;
LAB_00325ed1:
    *b = MVar4;
    MVar6 = miniscript::internal::operator|(a,b);
LAB_00325edc:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar11->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar11[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
LAB_00325f80:
    MVar4 = miniscript::internal::operator+
                      ((MaxInt<unsigned_int> *)((long)&peVar5->ops + 0xc),
                       (MaxInt<unsigned_int> *)((long)&peVar10->ops + 0xc));
LAB_00325f8d:
    __return_storage_ptr__->count = uVar8;
    __return_storage_ptr__->sat = MVar6;
    goto LAB_00325fb2;
  case OR_I:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar11->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar11[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    uVar8 = (peVar5->ops).count + (peVar10->ops).count + 3;
    MVar6 = miniscript::internal::operator|
                      ((MaxInt<unsigned_int> *)((long)&peVar5->ops + 4),
                       (MaxInt<unsigned_int> *)((long)&peVar10->ops + 4));
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    MVar4 = miniscript::internal::operator|
                      ((MaxInt<unsigned_int> *)
                       ((long)&((psVar11->
                                super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->ops + 0xc),
                       (MaxInt<unsigned_int> *)
                       ((long)&(psVar11[1].
                                super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->ops + 0xc));
    goto LAB_00325f8d;
  case ANDOR:
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar11->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar11[1].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    uVar8 = ((psVar11[2].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->ops).count + (peVar5->ops).count + (peVar10->ops).count + 3;
    sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)miniscript::internal::operator+
                            ((MaxInt<unsigned_int> *)((long)&peVar10->ops + 4),
                             (MaxInt<unsigned_int> *)((long)&peVar5->ops + 4));
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)miniscript::internal::operator+
                            ((MaxInt<unsigned_int> *)
                             ((long)&((psVar11->
                                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr)->ops + 0xc),
                             (MaxInt<unsigned_int> *)
                             ((long)&(psVar11[2].
                                      super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->ops + 4));
    MVar6 = miniscript::internal::operator|
                      ((MaxInt<unsigned_int> *)&sats,(MaxInt<unsigned_int> *)&next_sats);
    psVar11 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar5 = (psVar11->
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    peVar10 = psVar11[2].
              super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    goto LAB_00325f80;
  case THRESH:
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(next_sats.
                           super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
    next_sats.
    super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)next_sats.
                          super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff);
    Vector<miniscript::internal::MaxInt<unsigned_int>>(&sats,(MaxInt<unsigned_int> *)&next_sats);
    psVar3 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar8 = 0;
    for (psVar11 = (this->subs).
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar3;
        psVar11 = psVar11 + 1) {
      peVar5 = (psVar11->
               super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      uVar1 = (peVar5->ops).count;
      local_70 = miniscript::internal::operator+
                           (sats.
                            super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,&(peVar5->ops).dsat);
      Vector<miniscript::internal::MaxInt<unsigned_int>>(&next_sats,&local_70);
      uVar8 = uVar8 + uVar1 + 1;
      lVar7 = 0;
      for (uVar9 = 1;
          uVar9 < (ulong)((long)sats.
                                super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)sats.
                                super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1)
      {
        local_78 = miniscript::internal::operator+
                             ((MaxInt<unsigned_int> *)
                              (&sats.
                                super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].valid + lVar7),
                              &(((psVar11->
                                 super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->ops).dsat);
        local_80 = miniscript::internal::operator+
                             ((MaxInt<unsigned_int> *)
                              (&(sats.
                                 super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->valid + lVar7),
                              &(((psVar11->
                                 super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->ops).sat);
        local_70 = miniscript::internal::operator|(&local_78,&local_80);
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
        ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                  ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                    *)&next_sats,&local_70);
        lVar7 = lVar7 + 8;
      }
      local_70 = miniscript::internal::operator+
                           ((MaxInt<unsigned_int> *)
                            ((long)sats.
                                   super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                            ((long)sats.
                                   super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)sats.
                                  super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) + -8),
                            &(((psVar11->
                               super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->ops).sat);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
      ::emplace_back<miniscript::internal::MaxInt<unsigned_int>>
                ((vector<miniscript::internal::MaxInt<unsigned_int>,std::allocator<miniscript::internal::MaxInt<unsigned_int>>>
                  *)&next_sats,&local_70);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::_M_move_assign(&sats,(MaxInt<unsigned_int> *)&next_sats);
      std::
      _Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::~_Vector_base((_Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                       *)&next_sats);
    }
    if ((ulong)((long)sats.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)sats.
                      super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)this->k) {
      __assert_fail("k <= sats.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0x3db,
                    "internal::Ops miniscript::Node<unsigned int>::CalcOps() const [Key = unsigned int]"
                   );
    }
    MVar4 = sats.
            super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[this->k];
    MVar6 = *sats.
             super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __return_storage_ptr__->count = uVar8;
    __return_storage_ptr__->sat = MVar4;
    __return_storage_ptr__->dsat = MVar6;
    std::
    _Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::~_Vector_base(&sats.
                     super__Vector_base<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   );
    goto LAB_00325fb7;
  case MULTI:
    MVar4 = (MaxInt<unsigned_int>)
            (((long)(this->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start & 0xfffffffffffffffcU) * 0x40000000 + 1
            );
    __return_storage_ptr__->count = 1;
    goto LAB_00325fad;
  case MULTI_A:
    __return_storage_ptr__->count =
         (int)((ulong)((long)(this->keys).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(this->keys).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2) + 1;
LAB_00325faa:
    MVar4.valid = true;
    MVar4._1_3_ = 0;
    MVar4.value = 0;
LAB_00325fad:
    __return_storage_ptr__->sat = MVar4;
LAB_00325fb2:
    __return_storage_ptr__->dsat = MVar4;
    goto LAB_00325fb7;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x3df,
                  "internal::Ops miniscript::Node<unsigned int>::CalcOps() const [Key = unsigned int]"
                 );
  }
  (__return_storage_ptr__->sat).valid = true;
  *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
  (__return_storage_ptr__->sat).value = 0;
LAB_00325e7e:
  (__return_storage_ptr__->dsat).valid = false;
  *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
  (__return_storage_ptr__->dsat).value = 0;
LAB_00325fb7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

internal::Ops CalcOps() const {
        switch (fragment) {
            case Fragment::JUST_1: return {0, 0, {}};
            case Fragment::JUST_0: return {0, {}, 0};
            case Fragment::PK_K: return {0, 0, 0};
            case Fragment::PK_H: return {3, 0, 0};
            case Fragment::OLDER:
            case Fragment::AFTER: return {1, 0, {}};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {4, 0, {}};
            case Fragment::AND_V: return {subs[0]->ops.count + subs[1]->ops.count, subs[0]->ops.sat + subs[1]->ops.sat, {}};
            case Fragment::AND_B: {
                const auto count{1 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat + subs[1]->ops.sat};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_B: {
                const auto count{1 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{(subs[0]->ops.sat + subs[1]->ops.dsat) | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_D: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                const auto dsat{subs[0]->ops.dsat + subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::OR_C: {
                const auto count{2 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | (subs[1]->ops.sat + subs[0]->ops.dsat)};
                return {count, sat, {}};
            }
            case Fragment::OR_I: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count};
                const auto sat{subs[0]->ops.sat | subs[1]->ops.sat};
                const auto dsat{subs[0]->ops.dsat | subs[1]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::ANDOR: {
                const auto count{3 + subs[0]->ops.count + subs[1]->ops.count + subs[2]->ops.count};
                const auto sat{(subs[1]->ops.sat + subs[0]->ops.sat) | (subs[0]->ops.dsat + subs[2]->ops.sat)};
                const auto dsat{subs[0]->ops.dsat + subs[2]->ops.dsat};
                return {count, sat, dsat};
            }
            case Fragment::MULTI: return {1, (uint32_t)keys.size(), (uint32_t)keys.size()};
            case Fragment::MULTI_A: return {(uint32_t)keys.size() + 1, 0, 0};
            case Fragment::WRAP_S:
            case Fragment::WRAP_C:
            case Fragment::WRAP_N: return {1 + subs[0]->ops.count, subs[0]->ops.sat, subs[0]->ops.dsat};
            case Fragment::WRAP_A: return {2 + subs[0]->ops.count, subs[0]->ops.sat, subs[0]->ops.dsat};
            case Fragment::WRAP_D: return {3 + subs[0]->ops.count, subs[0]->ops.sat, 0};
            case Fragment::WRAP_J: return {4 + subs[0]->ops.count, subs[0]->ops.sat, 0};
            case Fragment::WRAP_V: return {subs[0]->ops.count + (subs[0]->GetType() << "x"_mst), subs[0]->ops.sat, {}};
            case Fragment::THRESH: {
                uint32_t count = 0;
                auto sats = Vector(internal::MaxInt<uint32_t>(0));
                for (const auto& sub : subs) {
                    count += sub->ops.count + 1;
                    auto next_sats = Vector(sats[0] + sub->ops.dsat);
                    for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + sub->ops.dsat) | (sats[j - 1] + sub->ops.sat));
                    next_sats.push_back(sats[sats.size() - 1] + sub->ops.sat);
                    sats = std::move(next_sats);
                }
                assert(k <= sats.size());
                return {count, sats[k], sats[0]};
            }
        }
        assert(false);
    }